

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O3

bool checkStaticArray(int *val,QByteArrayView dateString,int at,char *array,int size)

{
  char *__s;
  char cVar1;
  size_t sVar2;
  storage_type *psVar3;
  int iVar4;
  int iVar5;
  
  psVar3 = dateString.m_data;
  cVar1 = psVar3[at];
  if ((((byte)(cVar1 + 0x9fU) < 0x1a) && (*val == -1)) &&
     (iVar4 = 0, -1 < size && (long)(at + 3) <= dateString.m_size)) {
    iVar5 = 0;
    do {
      __s = array + iVar4;
      if (((array[iVar4] == cVar1) && (__s[1] == psVar3[(long)at + 1])) &&
         (__s[2] == psVar3[(long)at + 2])) {
        *val = iVar5;
        return true;
      }
      sVar2 = strlen(__s);
      iVar4 = iVar4 + (int)sVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar4 <= size);
  }
  return false;
}

Assistant:

static bool checkStaticArray(int &val, QByteArrayView dateString, int at, const char *array, int size)
{
    if (dateString[at] < 'a' || dateString[at] > 'z')
        return false;
    if (val == -1 && dateString.size() >= at + 3) {
        int j = 0;
        int i = 0;
        while (i <= size) {
            const char *str = array + i;
            if (str[0] == dateString[at]
                && str[1] == dateString[at + 1]
                && str[2] == dateString[at + 2]) {
                val = j;
                return true;
            }
            i += int(strlen(str)) + 1;
            ++j;
        }
    }
    return false;
}